

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS ref_iso_ghost(REF_GRID iso_grid,REF_EDGE ref_edge,REF_INT *new_node)

{
  uint uVar1;
  undefined8 local_88;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_GLOB global;
  REF_INT i;
  REF_INT part;
  REF_INT node;
  REF_INT edge;
  REF_DBL *edge_real;
  REF_INT *edge_part;
  REF_GLOB *edge_global;
  REF_MPI ref_mpi;
  REF_INT *new_node_local;
  REF_EDGE ref_edge_local;
  REF_GRID iso_grid_local;
  
  edge_global = (REF_GLOB *)iso_grid->mpi;
  ref_mpi = (REF_MPI)new_node;
  new_node_local = &ref_edge->n;
  ref_edge_local = (REF_EDGE)iso_grid;
  if (ref_edge->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x29,
           "ref_iso_ghost","malloc edge_global of REF_GLOB negative");
    iso_grid_local._4_4_ = 1;
  }
  else {
    edge_part = (REF_INT *)malloc((long)ref_edge->n << 3);
    if (edge_part == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x29,
             "ref_iso_ghost","malloc edge_global of REF_GLOB NULL");
      iso_grid_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < *new_node_local;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        (edge_part + (long)ref_malloc_init_i_2 * 2)[0] = -1;
        (edge_part + (long)ref_malloc_init_i_2 * 2)[1] = -1;
      }
      if (*new_node_local < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2a,
               "ref_iso_ghost","malloc edge_part of REF_INT negative");
        iso_grid_local._4_4_ = 1;
      }
      else {
        edge_real = (REF_DBL *)malloc((long)*new_node_local << 2);
        if (edge_real == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x2a,"ref_iso_ghost","malloc edge_part of REF_INT NULL");
          iso_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < *new_node_local;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            *(undefined4 *)((long)edge_real + (long)ref_private_macro_code_rss * 4) = 0xffffffff;
          }
          if (*new_node_local * 0xf < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x2c,"ref_iso_ghost","malloc edge_real of REF_DBL negative");
            iso_grid_local._4_4_ = 1;
          }
          else {
            _node = (REF_DBL *)malloc((long)(*new_node_local * 0xf) << 3);
            if (_node == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x2c,"ref_iso_ghost","malloc edge_real of REF_DBL NULL");
              iso_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_1 = 0;
                  SBORROW4(ref_private_macro_code_rss_1,*new_node_local * 0xf) !=
                  ref_private_macro_code_rss_1 + *new_node_local * -0xf < 0;
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                _node[ref_private_macro_code_rss_1] = -999.0;
              }
              for (part = 0; part < *new_node_local; part = part + 1) {
                i = (&ref_mpi->n)[part];
                if (i != -1) {
                  uVar1 = ref_edge_part((REF_EDGE)new_node_local,part,(REF_INT *)((long)&global + 4)
                                       );
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0x31,"ref_iso_ghost",(ulong)uVar1,"edge part");
                    return uVar1;
                  }
                  if (*(int *)((long)edge_global + 4) == global._4_4_) {
                    if (((i < 0) || (ref_edge_local->e2n[1] <= i)) ||
                       (*(long *)(*(long *)(ref_edge_local->e2n + 4) + (long)i * 8) < 0)) {
                      local_88 = 0xffffffffffffffff;
                    }
                    else {
                      local_88 = *(undefined8 *)(*(long *)(ref_edge_local->e2n + 4) + (long)i * 8);
                    }
                    *(undefined8 *)(edge_part + (long)part * 2) = local_88;
                    *(undefined4 *)((long)edge_real + (long)part * 4) =
                         *(undefined4 *)(*(long *)(ref_edge_local->e2n + 10) + (long)i * 4);
                    for (global._0_4_ = 0; (int)global < 0xf; global._0_4_ = (int)global + 1) {
                      _node[(int)global + part * 0xf] =
                           *(REF_DBL *)
                            (*(long *)(ref_edge_local->e2n + 0xe) +
                            (long)((int)global + i * 0xf) * 8);
                    }
                  }
                }
              }
              uVar1 = ref_edge_ghost_glob((REF_EDGE)new_node_local,(REF_MPI)edge_global,
                                          (REF_GLOB *)edge_part);
              if (uVar1 == 0) {
                uVar1 = ref_edge_ghost_int((REF_EDGE)new_node_local,(REF_MPI)edge_global,
                                           (REF_INT *)edge_real);
                if (uVar1 == 0) {
                  uVar1 = ref_edge_ghost_dbl((REF_EDGE)new_node_local,(REF_MPI)edge_global,_node,0xf
                                            );
                  if (uVar1 == 0) {
                    for (part = 0; part < *new_node_local; part = part + 1) {
                      if (*(long *)(edge_part + (long)part * 2) != -1) {
                        uVar1 = ref_node_add((REF_NODE)ref_edge_local->e2n,
                                             *(long *)(edge_part + (long)part * 2),&i);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                 ,0x45,"ref_iso_ghost",(ulong)uVar1,"add node");
                          return uVar1;
                        }
                        (&ref_mpi->n)[part] = i;
                        *(undefined4 *)(*(long *)(ref_edge_local->e2n + 10) + (long)i * 4) =
                             *(undefined4 *)((long)edge_real + (long)part * 4);
                        for (global._0_4_ = 0; (int)global < 0xf; global._0_4_ = (int)global + 1) {
                          *(REF_DBL *)
                           (*(long *)(ref_edge_local->e2n + 0xe) + (long)((int)global + i * 0xf) * 8
                           ) = _node[(int)global + part * 0xf];
                        }
                      }
                    }
                    if (_node != (REF_DBL *)0x0) {
                      free(_node);
                    }
                    if (edge_real != (REF_DBL *)0x0) {
                      free(edge_real);
                    }
                    if (edge_part != (REF_INT *)0x0) {
                      free(edge_part);
                    }
                    iso_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0x3f,"ref_iso_ghost",(ulong)uVar1,"xyz ghost");
                    iso_grid_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x3d,"ref_iso_ghost",(ulong)uVar1,"part ghost");
                  iso_grid_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x3c,"ref_iso_ghost",(ulong)uVar1,"global ghost");
                iso_grid_local._4_4_ = uVar1;
              }
            }
          }
        }
      }
    }
  }
  return iso_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_iso_ghost(REF_GRID iso_grid, REF_EDGE ref_edge,
                                        REF_INT *new_node) {
  REF_MPI ref_mpi = ref_grid_mpi(iso_grid);
  REF_GLOB *edge_global;
  REF_INT *edge_part;
  REF_DBL *edge_real;
  REF_INT edge, node, part, i;
  REF_GLOB global;

  ref_malloc_init(edge_global, ref_edge_n(ref_edge), REF_GLOB, REF_EMPTY);
  ref_malloc_init(edge_part, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(edge_real, REF_NODE_REAL_PER * ref_edge_n(ref_edge), REF_DBL,
                  -999.0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = new_node[edge];
    if (REF_EMPTY != node) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        edge_global[edge] = ref_node_global(ref_grid_node(iso_grid), node);
        edge_part[edge] = ref_node_part(ref_grid_node(iso_grid), node);
        for (i = 0; i < REF_NODE_REAL_PER; i++)
          edge_real[i + REF_NODE_REAL_PER * edge] =
              ref_node_real(ref_grid_node(iso_grid), i, node);
      }
    }
  }

  RSS(ref_edge_ghost_glob(ref_edge, ref_mpi, edge_global), "global ghost");
  RSS(ref_edge_ghost_int(ref_edge, ref_mpi, edge_part), "part ghost");
  RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_real, REF_NODE_REAL_PER),
      "xyz ghost");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    global = edge_global[edge];
    if (REF_EMPTY != global) {
      /* finds local if already inserted */
      RSS(ref_node_add(ref_grid_node(iso_grid), global, &node), "add node");
      new_node[edge] = node;
      ref_node_part(ref_grid_node(iso_grid), node) = edge_part[edge];
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        ref_node_real(ref_grid_node(iso_grid), i, node) =
            edge_real[i + REF_NODE_REAL_PER * edge];
    }
  }

  ref_free(edge_real);
  ref_free(edge_part);
  ref_free(edge_global);

  return REF_SUCCESS;
}